

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadBodyInertia::ComputeJacobian
          (ChLoadBodyInertia *this,ChState *state_x,ChStateDelta *state_w,ChMatrixRef mK,
          ChMatrixRef mR,ChMatrixRef mM)

{
  double *val;
  ChVector<double> *v;
  ChMatrix33<double> *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 local_338 [16];
  variable_if_dynamic<long,__1> local_328;
  scalar_constant_op<double> sStack_320;
  variable_if_dynamic<long,__1> local_318;
  variable_if_dynamic<long,__1> local_310;
  undefined1 auStack_308 [16];
  scalar_constant_op<double> local_2f8;
  RhsNested local_2f0;
  ChStarMatrix33<double> local_2d8;
  double local_290;
  shared_ptr<chrono::ChBody> mbody;
  ChVector<double> v_w;
  Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false> local_260;
  undefined8 local_228;
  undefined8 local_220;
  ulong local_218;
  undefined1 *puStack_210;
  RhsNested local_208;
  ChVector<double> a_w;
  ChVector<double> a_x;
  ulong local_1c0;
  double local_1b8;
  ulong local_1b0;
  Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false> local_1a8;
  ChStarMatrix33<double> local_170;
  undefined1 local_128 [16];
  scalar_constant_op<double> local_118;
  RhsNested local_110;
  undefined8 local_108;
  RhsNested local_100;
  ulong uStack_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  double local_d0;
  double local_c8;
  undefined8 local_c0;
  ulong local_b8;
  ulong uStack_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
  local_98;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
  local_70;
  ChVector<double> v_x;
  
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_338,
             &state_w->super_ChVectorDynamic<double>,0,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
            (&v_x,(MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
                  )local_338,(type *)0x0);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_338,
             &state_w->super_ChVectorDynamic<double>,3,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
            (&v_w,(MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
                  )local_338,(type *)0x0);
  std::dynamic_pointer_cast<chrono::ChBody,chrono::ChLoadable>
            ((shared_ptr<chrono::ChLoadable> *)&mbody);
  local_338._0_8_ =
       &((mbody.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_338,
                    &((mbody.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dtdt.pos);
  ChFrameMoving<double>::GetWacc_loc
            (&a_w,&((mbody.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   super_ChBodyFrame).super_ChFrameMoving<double>);
  local_2d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  local_e0 = 0;
  auVar17._0_8_ = -v_w.m_data[2];
  auVar17._8_8_ = 0x8000000000000000;
  local_2d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)vmovlpd_avx(auVar17);
  local_2d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       v_w.m_data[2];
  auVar13._8_8_ = v_w.m_data[1];
  auVar13._0_8_ = v_w.m_data[0];
  local_2d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  local_2d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       v_w.m_data[1];
  local_2d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       -v_w.m_data[0];
  local_2d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       -v_w.m_data[1];
  local_2d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (double)vmovlpd_avx(auVar13);
  local_2d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  local_c8 = (this->c_m).m_data[2];
  auVar18._0_8_ = -local_c8;
  auVar18._8_8_ = 0x8000000000000000;
  local_d8 = vmovlpd_avx(auVar18);
  local_c0 = 0;
  auVar13 = *(undefined1 (*) [16])(this->c_m).m_data;
  local_d0 = (this->c_m).m_data[1];
  local_b8 = auVar13._0_8_ ^ 0x8000000000000000;
  uStack_b0 = auVar13._8_8_ ^ 0x8000000000000000;
  local_a8 = vmovlpd_avx(auVar13);
  local_a0 = 0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
             &((this->super_ChLoadCustom).super_ChLoadBase.jacobians)->M);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false> *)&local_170,
             &((this->super_ChLoadCustom).super_ChLoadBase.jacobians)->M,0,0,3,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_-1,_false>_>::
  diagonal((DiagonalReturnType *)local_338,
           (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>_> *)
           &local_170);
  val = &this->mass;
  Eigen::
  DenseBase<Eigen::Diagonal<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_-1,_false>,_0>_>
  ::setConstant((DenseBase<Eigen::Diagonal<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_0>_>
                 *)local_338,val);
  local_310.m_value = (long)(this->c_m).m_data[0];
  local_338._0_8_ = (non_const_type)0x0;
  auVar13 = *(undefined1 (*) [16])((this->c_m).m_data + 1);
  local_338._8_8_ = (this->c_m).m_data[2];
  auVar19._0_8_ = -(double)local_310.m_value;
  auVar19._8_8_ = 0x8000000000000000;
  local_328.m_value = auVar13._0_8_ ^ 0x8000000000000000;
  sStack_320.m_other = (double)(auVar13._8_8_ ^ 0x8000000000000000);
  auStack_308 = vunpcklpd_avx(auVar13,auVar19);
  local_318.m_value = 0;
  local_2f8.m_other = 0.0;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                    *)&local_260,val,(StorageBaseType *)local_338);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false> *)&local_170,
             &((this->super_ChLoadCustom).super_ChLoadBase.jacobians)->M,0,3,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Matrix<double,3,3,1,3,3>const>>
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false> *)&local_170,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
              *)&local_260);
  local_338._0_8_ = (non_const_type)0x0;
  sStack_320.m_other = (this->c_m).m_data[2];
  auVar20._0_8_ = (ulong)sStack_320.m_other ^ 0x8000000000000000;
  auVar20._8_8_ = 0x8000000000000000;
  local_338._8_8_ = vmovlpd_avx(auVar20);
  local_318.m_value = 0;
  auVar13 = *(undefined1 (*) [16])(this->c_m).m_data;
  local_328.m_value = (long)(this->c_m).m_data[1];
  local_310.m_value = (long)-auVar13._0_8_;
  auStack_308._0_8_ = -auVar13._8_8_;
  auStack_308._8_8_ = vmovlpd_avx(auVar13);
  local_2f8.m_other = 0.0;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                    *)&local_260,val,(StorageBaseType *)local_338);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false> *)&local_170,
             &((this->super_ChLoadCustom).super_ChLoadBase.jacobians)->M,3,0,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Matrix<double,3,3,1,3,3>const>>
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false> *)&local_170,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
              *)&local_260);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false> *)local_338,
             &((this->super_ChLoadCustom).super_ChLoadBase.jacobians)->M,3,3,3,3);
  this_00 = &this->I;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false> *)local_338,
             &this_00->super_Matrix<double,_3,_3,_1,_3,_3>);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
             &((this->super_ChLoadCustom).super_ChLoadBase.jacobians)->R);
  v = &this->c_m;
  if (use_inertial_damping_matrix_R == '\x01') {
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *val;
    auVar7._8_8_ = 0x8000000000000000;
    auVar7._0_8_ = 0x8000000000000000;
    auVar13 = vxorpd_avx512vl(auVar14,auVar7);
    local_98._0_8_ = vmovlpd_avx(auVar13);
    ChStarMatrix33<double>::operator*(&local_2d8,v);
    local_338._0_8_ = (non_const_type)0x0;
    local_128._8_8_ = &local_e0;
    auVar21._0_8_ =
         -(double)local_1a8.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_0>
                  .m_cols.m_value;
    auVar21._8_8_ = 0x8000000000000000;
    local_338._8_8_ = vmovlpd_avx(auVar21);
    sStack_320.m_other =
         (double)local_1a8.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_0>
                 .m_cols.m_value;
    auVar11._8_8_ =
         local_1a8.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_0>.
         m_rows.m_value;
    auVar11._0_8_ =
         local_1a8.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_0>.
         m_data;
    local_318.m_value = 0;
    local_328.m_value =
         local_1a8.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_0>.
         m_rows.m_value;
    local_310.m_value =
         (ulong)local_1a8.
                super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>
                .
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_0>
                .m_data ^ 0x8000000000000000;
    auStack_308._0_8_ =
         local_1a8.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_0>.
         m_rows.m_value ^ 0x8000000000000000;
    auStack_308._8_8_ = vmovlpd_avx(auVar11);
    local_2f8.m_other = 0.0;
    local_128._0_8_ = &local_2d8;
    local_118.m_other = (double)local_338;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                      *)&local_170,(double *)&local_98,(StorageBaseType *)local_128);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_-1,_false>::Block
              (&local_260,&((this->super_ChLoadCustom).super_ChLoadBase.jacobians)->R,0,3,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>const,Eigen::Matrix<double,3,3,1,3,3>const>const>>
              (&local_260,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                *)&local_170);
    ChMatrix33<double>::operator*(this_00,&v_w);
    local_338._0_8_ = (non_const_type)0x0;
    auVar22._0_8_ = -local_118.m_other;
    auVar22._8_8_ = 0x8000000000000000;
    local_338._8_8_ = vmovlpd_avx(auVar22);
    sStack_320.m_other = local_118.m_other;
    auVar12._8_8_ = local_128._8_8_;
    auVar12._0_8_ = local_128._0_8_;
    local_318.m_value = 0;
    local_328.m_value = local_128._8_8_;
    local_310.m_value = (long)-(double)local_128._0_8_;
    auStack_308._0_8_ = -(double)local_128._8_8_;
    auStack_308._8_8_ = vmovlpd_avx(auVar12);
    local_2f8.m_other = 0.0;
    local_260.super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_0>.m_data =
         (PointerType)&local_2d8;
    local_260.super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_0>.m_rows.
    m_value = (long)this_00;
    local_260.super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_0>.m_cols.
    m_value = (long)local_338;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false> *)&local_170,
               &((this->super_ChLoadCustom).super_ChLoadBase.jacobians)->R,3,3,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>const,Eigen::Matrix<double,3,3,1,3,3>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false> *)&local_170,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                *)&local_260);
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
             &((this->super_ChLoadCustom).super_ChLoadBase.jacobians)->K);
  if (use_inertial_stiffness_matrix_K == '\x01') {
    local_170.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    auVar23._0_8_ = -a_w.m_data[2];
    auVar23._8_8_ = 0x8000000000000000;
    local_170.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)vmovlpd_avx(auVar23);
    local_170.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         a_w.m_data[2];
    auVar9._8_8_ = a_w.m_data[1];
    auVar9._0_8_ = a_w.m_data[0];
    local_170.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
    local_170.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         a_w.m_data[1];
    local_170.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         (double)((ulong)a_w.m_data[0] ^ 0x8000000000000000);
    local_170.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         -a_w.m_data[1];
    local_170.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         (double)vmovlpd_avx(auVar9);
    local_170.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
    auVar15._0_8_ = -*val;
    auVar15._8_8_ = 0x8000000000000000;
    local_290 = (double)vmovlpd_avx(auVar15);
    ChStarMatrix33<double>::operator*(&local_170,v);
    local_260.super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_0>.m_data =
         (PointerType)0x0;
    auVar24._0_8_ = (ulong)local_208 ^ 0x8000000000000000;
    auVar24._8_8_ = 0x8000000000000000;
    local_260.super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_0>.m_rows.
    m_value = vmovlpd_avx(auVar24);
    local_260.super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)local_208;
    auVar8._8_8_ = puStack_210;
    auVar8._0_8_ = local_218;
    local_260.super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>.m_startRow
    .m_value = 0;
    local_260.super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_0>.m_cols.
    m_value = (long)puStack_210;
    local_260.super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>.m_startCol
    .m_value = local_218 ^ 0x8000000000000000;
    local_260.super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>.
    m_outerStride = (ulong)puStack_210 ^ 0x8000000000000000;
    local_228 = vmovlpd_avx(auVar8);
    local_220 = 0;
    Eigen::operator*(&local_98,&local_290,(StorageBaseType *)&local_260);
    ChStarMatrix33<double>::operator*(&local_2d8,v);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_1c0;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_1b0;
    local_128._0_8_ = (ChStarMatrix33<double> *)0x0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_2d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar25._8_8_ = 0;
    auVar25._0_8_ =
         local_1b8 *
         local_2d8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar13 = vfmadd231sd_fma(auVar25,auVar16,auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_2d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar27._8_8_ = 0;
    auVar27._0_8_ =
         local_1b8 *
         local_2d8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar17 = vfmadd231sd_fma(auVar27,auVar16,auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_2d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
    auVar30._8_8_ = 0;
    auVar30._0_8_ =
         local_1b8 *
         local_2d8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar18 = vfmadd231sd_fma(auVar30,auVar16,auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_2d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar13 = vfmadd231sd_fma(auVar13,auVar28,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_2d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar17 = vfmadd231sd_fma(auVar17,auVar28,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_2d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
    auVar18 = vfmadd231sd_fma(auVar18,auVar28,auVar6);
    local_110 = auVar13._0_8_;
    auVar29._0_8_ = (ulong)local_110 ^ 0x8000000000000000;
    auVar29._8_8_ = auVar13._8_8_ ^ 0x8000000000000000;
    local_128._8_8_ = vmovlpd_avx(auVar29);
    auVar13 = vunpcklpd_avx(auVar17,auVar18);
    local_118.m_other = auVar18._0_8_;
    local_108 = 0;
    local_100 = (RhsNested)(auVar13._0_8_ ^ 0x8000000000000000);
    uStack_f8 = auVar13._8_8_ ^ 0x8000000000000000;
    local_f0 = auVar17._0_8_;
    local_e8 = 0;
    Eigen::operator*(&local_70,val,(StorageBaseType *)local_128);
    sStack_320.m_other = local_98.m_lhs.m_functor.m_other;
    local_318.m_value = (long)local_98.m_rhs;
    local_2f8.m_other = local_70.m_lhs.m_functor.m_other;
    local_2f0 = local_70.m_rhs;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_-1,_false>::Block
              (&local_1a8,&((this->super_ChLoadCustom).super_ChLoadBase.jacobians)->K,0,3,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Matrix<double,3,3,1,3,3>const>const>>
              (&local_1a8,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                *)local_338);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                      *)&local_1a8,val,(StorageBaseType *)&local_e0);
    local_338._0_8_ = (non_const_type)0x0;
    auVar26._0_8_ = -a_x.m_data[2];
    auVar26._8_8_ = 0x8000000000000000;
    local_338._8_8_ = vmovlpd_avx(auVar26);
    sStack_320.m_other = a_x.m_data[2];
    auVar10._8_8_ = a_x.m_data[1];
    auVar10._0_8_ = a_x.m_data[0];
    local_318.m_value = 0;
    local_328.m_value = (long)a_x.m_data[1];
    local_310.m_value = (long)-a_x.m_data[0];
    auStack_308._0_8_ = -a_x.m_data[1];
    auStack_308._8_8_ = vmovlpd_avx(auVar10);
    local_2f8.m_other = 0.0;
    local_118.m_other =
         (double)local_1a8.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false>,_0>
                 .m_cols.m_value;
    local_110 = (RhsNested)
                local_1a8.
                super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,__1,_false,_true>
                .m_xpr;
    local_100 = (RhsNested)local_338;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_-1,_false>::Block
              (&local_260,&((this->super_ChLoadCustom).super_ChLoadBase.jacobians)->K,3,3,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Matrix<double,3,3,1,3,3>const>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&local_260,
               (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                *)local_128);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mbody.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void ChLoadBodyInertia::ComputeJacobian(ChState* state_x,       ///< state position to evaluate jacobians
    ChStateDelta* state_w,  ///< state speed to evaluate jacobians
    ChMatrixRef mK,         ///< result dQ/dx
    ChMatrixRef mR,         ///< result dQ/dv
    ChMatrixRef mM          ///< result dQ/da
) {
    // fetch speeds as 3d vectors for convenience
    ChVector<> v_x = state_w->segment(0,3); // abs. 
    ChVector<> v_w = state_w->segment(3,3); // local 
    // (note: accelerations should be fetched from a "state_acc" like we did for speeds with state_w, 
    // but acc. are not available in ComputeQ inputs... maybe in future we should change the ChLoad 
    // class to support also this. For this special case, it works also with the following trick, but 
    // would fail the default numerical differentiation in ComputeJacobian() for the M=dQ/da matrix, so 
    // we override ComputeJacobian and provide the analytical jacobians)
    auto mbody = std::dynamic_pointer_cast<ChBody>(this->loadable);
    ChVector<> a_x = mbody->GetA().transpose() * mbody->GetPos_dtdt(); // local 
    ChVector<> a_w = mbody->GetWacc_loc(); // local 
    
    ChStarMatrix33<> wtilde(v_w);  // [w~]
    ChStarMatrix33<> ctilde(c_m);  // [c~]

    // Analytic expression of inertial load jacobians.
    // Note signs: positive as they go in LHS. 

    // M mass matrix terms (6x6, split in four 3x3 blocks for convenience)
    jacobians->M.setZero();
    jacobians->M.block(0, 0, 3, 3).diagonal().setConstant(this->mass);
    jacobians->M.block(0, 3, 3, 3) = this->mass * chrono::ChStarMatrix33<>(-this->c_m);
    jacobians->M.block(3, 0, 3, 3) = this->mass * chrono::ChStarMatrix33<>(this->c_m);
    jacobians->M.block(3, 3, 3, 3) = this->I;

    // R gyroscopic damping matrix terms (6x6, split in 3x3 blocks for convenience)
    jacobians->R.setZero();
    if (this->use_inertial_damping_matrix_R) {
        //  Ri = [0, - m*[w~][c~] - m*[([w~]*c)~]  ; 0 , [w~][I] - [([I]*w)~]  ]
        jacobians->R.block(0, 3, 3, 3) = -this->mass * (wtilde * ctilde + ChStarMatrix33<>(wtilde * c_m));
        jacobians->R.block(3, 3, 3, 3) = wtilde * I - ChStarMatrix33<>(I * v_w);
    }

    // K inertial stiffness matrix terms (6x6, split in 3x3 blocks for convenience)
    jacobians->K.setZero();
    if (this->use_inertial_stiffness_matrix_K) {
        ChStarMatrix33<> atilde(a_w);  // [a~]
        // Ki_al = [0, -m*[([a~]c)~] -m*[([w~][w~]c)~] ; 0, m*[c~][xpp~] ]
        jacobians->K.block(0, 3, 3, 3) = -this->mass * ChStarMatrix33<>(atilde * c_m) - this->mass * ChStarMatrix33<>(wtilde * (wtilde * c_m));
        jacobians->K.block(3, 3, 3, 3) = this->mass * ctilde * ChStarMatrix33<>(a_x);
    }
}